

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::AsmJsByteCodeWriter::AsmSimdTypedArr
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,uint8 dataWidth,
          ViewType viewType,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (0xc < (byte)(dataWidth - 4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x26e,"(dataWidth >= 4 && dataWidth <= 16)",
                                "dataWidth >= 4 && dataWidth <= 16");
    if (!bVar2) goto LAB_0073ef3b;
    *puVar3 = 0;
  }
  bVar2 = TryWriteAsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,value,slotIndex,dataWidth,viewType,offset);
  if (!bVar2) {
    bVar2 = TryWriteAsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,op,value,slotIndex,dataWidth,viewType,offset);
    if (!bVar2) {
      bVar2 = TryWriteAsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,op,value,slotIndex,dataWidth,viewType,offset);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                    ,0x26f,"(success)","success");
        if (!bVar2) {
LAB_0073ef3b:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmSimdTypedArr(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, uint8 dataWidth, ArrayBufferView::ViewType viewType, uint32 offset)
    {
        Assert(dataWidth >= 4 && dataWidth <= 16);
        MULTISIZE_LAYOUT_WRITE(AsmSimdTypedArr, op, value, slotIndex, dataWidth, viewType, offset);
    }